

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymer.cpp
# Opt level: O0

void __thiscall Polymer::CheckBehind(Polymer *this,int old_start,int new_start)

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  string *psVar4;
  SpeciesTracker *this_00;
  reference pIVar5;
  FixedElement *pFVar6;
  element_type *this_01;
  bool local_122;
  Interval<std::shared_ptr<ReleaseSite>,_unsigned_long> *interval_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
  *__range1_1;
  vector<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
  term_results;
  string local_a8;
  allocator local_81;
  string local_80;
  reference local_60;
  Interval<std::shared_ptr<BindingSite>,_unsigned_long> *interval;
  iterator __end1;
  iterator __begin1;
  vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  *__range1;
  undefined1 local_30 [8];
  vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  results;
  int new_start_local;
  int old_start_local;
  Polymer *this_local;
  
  results.
  super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = new_start;
  results.
  super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = old_start;
  std::
  vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  ::vector((vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
            *)local_30);
  IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>::findOverlapping
            (&this->binding_sites_,
             (long)results.
                   super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
             (long)((int)results.
                         super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 1),
             (vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
              *)local_30);
  __end1 = std::
           vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
           ::begin((vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
                    *)local_30);
  interval = (Interval<std::shared_ptr<BindingSite>,_unsigned_long> *)
             std::
             vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
             ::end((vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
                    *)local_30);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_*,_std::vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>_>
                                     *)&interval), bVar1) {
    local_60 = __gnu_cxx::
               __normal_iterator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_*,_std::vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>_>
               ::operator*(&__end1);
    pFVar6 = &std::__shared_ptr_access<BindingSite,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<BindingSite,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&local_60->value)->super_FixedElement;
    iVar2 = FixedElement::stop(pFVar6);
    if (iVar2 < (int)results.
                     super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      pFVar6 = &std::__shared_ptr_access<BindingSite,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<BindingSite,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&local_60->value)->super_FixedElement;
      FixedElement::Uncover(pFVar6);
      pFVar6 = &std::__shared_ptr_access<BindingSite,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<BindingSite,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&local_60->value)->super_FixedElement;
      bVar1 = FixedElement::WasUncovered(pFVar6);
      if (bVar1) {
        peVar3 = std::__shared_ptr_access<BindingSite,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<BindingSite,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&local_60->value);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_80,"__ribosome",&local_81);
        BindingSite::CheckInteraction(peVar3,&local_80);
        std::__cxx11::string::~string((string *)&local_80);
        std::allocator<char>::~allocator((allocator<char> *)&local_81);
        pFVar6 = &std::__shared_ptr_access<BindingSite,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<BindingSite,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&local_60->value)->super_FixedElement;
        psVar4 = FixedElement::name_abi_cxx11_(pFVar6);
        LogUncover(this,psVar4);
        pFVar6 = &std::__shared_ptr_access<BindingSite,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<BindingSite,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&local_60->value)->super_FixedElement;
        term_results.
        super__Vector_base<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
        term_results.
        super__Vector_base<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._5_1_ = 0;
        bVar1 = FixedElement::first_exposure(pFVar6);
        local_122 = false;
        if (!bVar1) {
          peVar3 = std::__shared_ptr_access<BindingSite,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<BindingSite,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&local_60->value);
          std::allocator<char>::allocator();
          term_results.
          super__Vector_base<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
          std::__cxx11::string::string
                    ((string *)&local_a8,"__ribosome",
                     (allocator *)
                     ((long)&term_results.
                             super__Vector_base<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
          term_results.
          super__Vector_base<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._5_1_ = 1;
          local_122 = BindingSite::CheckInteraction(peVar3,&local_a8);
        }
        if ((term_results.
             super__Vector_base<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._5_1_ & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_a8);
        }
        if ((term_results.
             super__Vector_base<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ & 1) != 0) {
          std::allocator<char>::~allocator
                    ((allocator<char> *)
                     ((long)&term_results.
                             super__Vector_base<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        }
        if (local_122 != false) {
          this_00 = SpeciesTracker::Instance();
          pFVar6 = &std::__shared_ptr_access<BindingSite,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<BindingSite,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)&local_60->value)->super_FixedElement;
          psVar4 = FixedElement::gene_abi_cxx11_(pFVar6);
          SpeciesTracker::IncrementTranscript(this_00,psVar4,1);
          pFVar6 = &std::__shared_ptr_access<BindingSite,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<BindingSite,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)&local_60->value)->super_FixedElement;
          FixedElement::first_exposure(pFVar6,true);
          this->total_elements_ = this->total_elements_ + 1;
        }
      }
      pFVar6 = &std::__shared_ptr_access<BindingSite,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<BindingSite,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&local_60->value)->super_FixedElement;
      FixedElement::ResetState(pFVar6);
    }
    __gnu_cxx::
    __normal_iterator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_*,_std::vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>_>
    ::operator++(&__end1);
  }
  std::
  vector<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
  ::vector((vector<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
            *)&__range1_1);
  IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>::findOverlapping
            (&this->release_sites_,
             (long)results.
                   super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
             (long)((int)results.
                         super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 1),
             (vector<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
              *)&__range1_1);
  __end1_1 = std::
             vector<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
             ::begin((vector<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
                      *)&__range1_1);
  interval_1 = (Interval<std::shared_ptr<ReleaseSite>,_unsigned_long> *)
               std::
               vector<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
               ::end((vector<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
                      *)&__range1_1);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_*,_std::vector<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>_>
                             *)&interval_1), bVar1) {
    pIVar5 = __gnu_cxx::
             __normal_iterator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_*,_std::vector<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>_>
             ::operator*(&__end1_1);
    pFVar6 = &std::__shared_ptr_access<ReleaseSite,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<ReleaseSite,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&pIVar5->value)->super_FixedElement;
    iVar2 = FixedElement::stop(pFVar6);
    if (iVar2 < (int)results.
                     super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      pFVar6 = &std::__shared_ptr_access<ReleaseSite,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<ReleaseSite,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&pIVar5->value)->super_FixedElement;
      FixedElement::Uncover(pFVar6);
      pFVar6 = &std::__shared_ptr_access<ReleaseSite,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<ReleaseSite,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&pIVar5->value)->super_FixedElement;
      bVar1 = FixedElement::WasUncovered(pFVar6);
      if (bVar1) {
        this_01 = std::__shared_ptr_access<ReleaseSite,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<ReleaseSite,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&pIVar5->value);
        ReleaseSite::readthrough(this_01,false);
      }
      pFVar6 = &std::__shared_ptr_access<ReleaseSite,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<ReleaseSite,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&pIVar5->value)->super_FixedElement;
      FixedElement::ResetState(pFVar6);
    }
    __gnu_cxx::
    __normal_iterator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_*,_std::vector<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>_>
    ::operator++(&__end1_1);
  }
  std::
  vector<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
  ::~vector((vector<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
             *)&__range1_1);
  std::
  vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  ::~vector((vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
             *)local_30);
  return;
}

Assistant:

void Polymer::CheckBehind(int old_start, int new_start) {
  std::vector<Interval<BindingSite::Ptr>> results;
  binding_sites_.findOverlapping(old_start, new_start + 1, results);
  for (auto &interval : results) {
    // std::cout << interval.value->name() + " " +
    //                  std::to_string(interval.value->start()) +
    //                  std::to_string(interval.value->stop()) + " " +
    //                  std::to_string(new_start)
    //           << std::endl;
    if (interval.value->stop() < new_start) {
      // std::cout << interval.value->name() << std::endl;
      interval.value->Uncover();
      if (interval.value->WasUncovered()) {
        if (interval.value->CheckInteraction("__ribosome")) {
          // std::cout << "RBS uncovered!" << std::endl;
        }
        // Record changes that species was covered
        LogUncover(interval.value->name());
        // Is this a new transcript?
        if (!interval.value->first_exposure() &&
            interval.value->CheckInteraction("__ribosome")) {
          SpeciesTracker::Instance().IncrementTranscript(interval.value->gene(),
                                                         1);
          interval.value->first_exposure(true);
          total_elements_ += 1;
        }
      }
      interval.value->ResetState();
    }
  }

  std::vector<Interval<ReleaseSite::Ptr>> term_results;
  release_sites_.findOverlapping(old_start, new_start + 1, term_results);
  for (auto &interval : term_results) {
    if (interval.value->stop() < new_start) {
      interval.value->Uncover();
      // if (interval.value->name() != "stop_codon") {
      //   std::cout << "Terminator uncovered!" + interval.value->name()
      //             << std::endl;
      //   std::cout << interval.value->IsCovered() << std::endl;
      // }
      if (interval.value->WasUncovered()) {
        // Record changes that species was covered
        // LogUncover(interval.value->name());
        // Is this a terminator being uncovered?
        // if (interval.value->name() != "stop_codon") {
        //   std::cout << "Readthrough set to false!" << std::endl;
        // }
        interval.value->readthrough(false);
      }
      interval.value->ResetState();
    }
  }
}